

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O1

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  void *local_38;
  iterator iStack_30;
  Arg **local_28;
  Arg *local_18;
  
  local_38 = (void *)0x0;
  iStack_30._M_current = (Arg **)0x0;
  local_28 = (Arg **)0x0;
  local_18 = a;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_38,(iterator)0x0,&local_18);
  local_18 = b;
  if (iStack_30._M_current == local_28) {
    std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
              ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_38,iStack_30,&local_18);
  }
  else {
    *iStack_30._M_current = b;
    iStack_30._M_current = iStack_30._M_current + 1;
  }
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[5])(this,&local_38);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}